

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnSectionSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,Index section_index)

{
  Result RVar1;
  string_view sVar2;
  
  sVar2 = BinaryReaderObjdumpBase::GetSectionName
                    (&this->super_BinaryReaderObjdumpBase,section_index);
  if (sVar2.size_ != 0) {
    PrintDetails(this,"   - %d: S <%.*s> section=%u",(ulong)index,sVar2.size_,sVar2.data_,
                 (ulong)section_index);
    RVar1 = PrintSymbolFlags(this,flags);
    return (Result)RVar1.enum_;
  }
  __assert_fail("!sym_name.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-reader-objdump.cc"
                ,0x738,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderObjdump::OnSectionSymbol(Index, uint32_t, Index)"
               );
}

Assistant:

Result BinaryReaderObjdump::OnSectionSymbol(Index index,
                                            uint32_t flags,
                                            Index section_index) {
  auto sym_name = GetSectionName(section_index);
  assert(!sym_name.empty());
  PrintDetails("   - %d: S <" PRIstringview "> section=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(sym_name), section_index);
  return PrintSymbolFlags(flags);
}